

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

float64 vector_vqgen(float32 **data,int32 rows,int32 cols,int32 vqrows,float64 epsilon,int32 maxiter
                    ,float32 **mean,int32 *map,int32 seed)

{
  int *piVar1;
  uint uVar2;
  float32 *pfVar3;
  float32 *pfVar4;
  undefined1 auVar5 [16];
  size_t __n;
  int32 iVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  unsigned_long s;
  ulong uVar14;
  ulong uVar15;
  size_t n_elem;
  double dVar16;
  double dVar17;
  float64 t;
  ptmr_t tm;
  uint local_cc;
  double local_a8;
  ulong local_a0;
  double local_98;
  size_t local_90;
  ulong local_88;
  float32 *local_80;
  float64 local_78;
  size_t local_70;
  ptmr_t local_68;
  
  local_78 = epsilon;
  if (((0.0 < (double)epsilon) && (vqrows <= rows)) && (-1 < maxiter)) {
    iVar10 = rows + 0x3e;
    if (-1 < rows + 0x1f) {
      iVar10 = rows + 0x1f;
    }
    pvVar7 = __ckd_calloc__((long)(iVar10 >> 5),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                            ,0x193);
    ptmr_init(&local_68);
    ptmr_start(&local_68);
    if (seed < 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
              ,0x19d,"You are using the internal mechanism of vector_vqgen to decide the seed.  \n")
      ;
      uVar15 = time((time_t *)0x0);
      s = uVar15 & 0xffffffff;
    }
    else {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
              ,0x1a7,"You are using %d as the seed \n",(ulong)(uint)seed);
      s = (unsigned_long)(uint)seed;
    }
    genrand_seed(s);
    n_elem = (size_t)cols;
    local_a0 = (ulong)(uint)vqrows;
    if (0 < vqrows) {
      uVar15 = 0;
      do {
        lVar8 = genrand_int31();
        auVar5 = ZEXT416((uint)lVar8 & 0x7fffffff) % SEXT816((long)rows);
        uVar12 = auVar5._0_8_;
        uVar9 = uVar12 >> 5 & 0x7ffffff;
        uVar2 = *(uint *)((long)pvVar7 + uVar9 * 4);
        uVar13 = (uint)(1L << (auVar5[0] & 0x1f));
        for (uVar11 = uVar2 >> (auVar5._0_4_ & 0x1f); (uVar11 & 1) != 0;
            uVar11 = uVar2 >> (uVar11 & 0x1f)) {
          uVar11 = (int)uVar12 + 1;
          if (rows <= (int)uVar11) {
            uVar11 = 0;
          }
          uVar12 = (ulong)uVar11;
          uVar9 = (ulong)(uVar11 >> 5);
          uVar2 = *(uint *)((long)pvVar7 + uVar9 * 4);
          uVar13 = (uint)(1L << ((byte)uVar11 & 0x1f));
        }
        *(uint *)((long)pvVar7 + uVar9 * 4) = uVar13 | uVar2;
        memcpy(mean[uVar15],data[uVar12 & 0xffffffff],n_elem * 4);
        uVar15 = uVar15 + 1;
      } while (uVar15 != local_a0);
    }
    ckd_free(pvVar7);
    pvVar7 = __ckd_calloc__((long)vqrows,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                            ,0x1bf);
    local_80 = (float32 *)
               __ckd_calloc__(n_elem,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                              ,0x1c2);
    vector_mean(local_80,mean,vqrows,cols);
    uVar15 = (ulong)(uint)cols;
    local_90 = n_elem << 2;
    local_70 = uVar15 * 4;
    local_88 = (ulong)(uint)rows;
    local_cc = 0;
    dVar16 = 0.0;
    while( true ) {
      uVar9 = local_88;
      dVar17 = 0.0;
      local_98 = dVar16;
      if (0 < rows) {
        uVar12 = 0;
        do {
          iVar6 = vector_vqlabel(data[uVar12],mean,vqrows,cols,(float64 *)&local_a8);
          map[uVar12] = iVar6;
          dVar17 = dVar17 + local_a8;
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
      }
      dVar16 = dVar17;
      ptmr_stop(&local_68);
      if (local_cc == 0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                ,0x1d0,"Iter %4d: %.1fs CPU; sqerr= %e\n",local_68.t_cpu,dVar16,0);
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                ,0x1d3,"Iter %4d: %.1fs CPU; sqerr= %e; delta= %e\n",local_68.t_cpu,dVar16,
                (local_98 - dVar16) / local_98,(ulong)local_cc);
      }
      __n = local_90;
      uVar9 = local_a0;
      if (((dVar16 == 0.0) && (!NAN(dVar16))) ||
         ((maxiter + -1 <= (int)local_cc ||
          ((local_cc != 0 && ((local_98 - dVar16) / local_98 < (double)local_78)))))) break;
      ptmr_start(&local_68);
      if (0 < vqrows) {
        uVar12 = 0;
        do {
          if (0 < cols) {
            memset(mean[uVar12],0,local_70);
          }
          *(undefined4 *)((long)pvVar7 + uVar12 * 4) = 0;
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
      }
      if (0 < rows) {
        uVar12 = 0;
        do {
          iVar10 = map[uVar12];
          if (0 < cols) {
            pfVar3 = mean[iVar10];
            pfVar4 = data[uVar12];
            uVar14 = 0;
            do {
              pfVar3[uVar14] = (float32)((float)pfVar4[uVar14] + (float)pfVar3[uVar14]);
              uVar14 = uVar14 + 1;
            } while (uVar15 != uVar14);
          }
          piVar1 = (int *)((long)pvVar7 + (long)iVar10 * 4);
          *piVar1 = *piVar1 + 1;
          uVar12 = uVar12 + 1;
        } while (uVar12 != local_88);
      }
      if (0 < vqrows) {
        uVar12 = 0;
        do {
          iVar10 = *(int *)((long)pvVar7 + uVar12 * 4);
          if (iVar10 < 2) {
            if (iVar10 == 0) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                      ,0x1ef,"Iter %d: mean[%d] unmapped\n",(ulong)local_cc,uVar12 & 0xffffffff);
              memcpy(mean[uVar12],local_80,__n);
            }
          }
          else {
            local_a8 = 1.0 / (double)iVar10;
            if (0 < cols) {
              pfVar3 = mean[uVar12];
              uVar14 = 0;
              do {
                pfVar3[uVar14] = (float32)(float)((double)(float)pfVar3[uVar14] * local_a8);
                uVar14 = uVar14 + 1;
              } while (uVar15 != uVar14);
            }
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar9);
      }
      local_cc = local_cc + 1;
    }
    ckd_free(pvVar7);
    ckd_free(local_80);
    return (float64)dVar16;
  }
  __assert_fail("(rows >= vqrows) && (maxiter >= 0) && (epsilon > 0.0)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                ,0x191,
                "float64 vector_vqgen(float32 **, int32, int32, int32, float64, int32, float32 **, int32 *, int32)"
               );
}

Assistant:

float64
vector_vqgen(float32 ** data, int32 rows, int32 cols, int32 vqrows,
             float64 epsilon, int32 maxiter,
             float32 ** mean, int32 * map, int32 seed)
{
    int32 i, j, r, it;
    float64 sqerr, prev_sqerr = 0, t;
    bitvec_t *sel;
    int32 *count;
    float32 *gmean;
    ptmr_t tm;

    assert((rows >= vqrows) && (maxiter >= 0) && (epsilon > 0.0));

    sel = bitvec_alloc(rows);

    ptmr_init(&tm);
    ptmr_start(&tm);


    /* Pick a random initial set of centroids */

    if (seed < 0) {
        E_INFO
            ("You are using the internal mechanism of vector_vqgen to decide the seed.  \n");
        s3_rand_seed((unsigned) time(NULL));

    }
    else {

        /*ARCHAN: DON'T delete this line! This will always give the
           experimenter the seed they were using in their experiments. This
           make the result be repeatable */

        E_INFO("You are using %d as the seed \n", seed);
        s3_rand_seed(seed);
    }


    for (i = 0; i < vqrows; i++) {
        /* Find r = a random, previously unselected row from the input */

        r = (s3_rand_int31() & (int32) 0x7fffffff) % rows;

        /*        r = (rand() & (int32)0x7fffffff) % rows; */

        while (bitvec_is_set(sel, r)) { /* BUG: possible infinite loop!! */
            if (++r >= rows)
                r = 0;
        }
        bitvec_set(sel, r);

        memcpy((void *) (mean[i]), (void *) (data[r]),
               cols * sizeof(float32));
        /* BUG: What if two randomly selected rows are identical in content?? */
    }
    bitvec_free(sel);

    count = (int32 *) ckd_calloc(vqrows, sizeof(int32));

    /* In k-means, unmapped means in any iteration are a problem.  Replace them with gmean */
    gmean = (float32 *) ckd_calloc(cols, sizeof(float32));
    vector_mean(gmean, mean, vqrows, cols);

    for (it = 0;; it++) {       /* Iterations of k-means algorithm */
        /* Find the current data->mean mappings (labels) */
        sqerr = 0.0;
        for (i = 0; i < rows; i++) {
            map[i] = vector_vqlabel(data[i], mean, vqrows, cols, &t);
            sqerr += t;
        }
        ptmr_stop(&tm);

        if (it == 0)
            E_INFO("Iter %4d: %.1fs CPU; sqerr= %e\n", it, tm.t_cpu,
                   sqerr);
        else
            E_INFO("Iter %4d: %.1fs CPU; sqerr= %e; delta= %e\n",
                   it, tm.t_cpu, sqerr, (prev_sqerr - sqerr) / prev_sqerr);

        /* Check if exit condition satisfied */
        if ((sqerr == 0.0) || (it >= maxiter - 1) ||
            ((it > 0) && (((prev_sqerr - sqerr) / prev_sqerr) < epsilon)))
            break;
        prev_sqerr = sqerr;

        ptmr_start(&tm);

        /* Update (reestimate) means */
        for (i = 0; i < vqrows; i++) {
            for (j = 0; j < cols; j++)
                mean[i][j] = 0.0;
            count[i] = 0;
        }
        for (i = 0; i < rows; i++) {
            vector_accum(mean[map[i]], data[i], cols);
            count[map[i]]++;
        }
        for (i = 0; i < vqrows; i++) {
            if (count[i] > 1) {
                t = 1.0 / (float64) (count[i]);
                for (j = 0; j < cols; j++)
                    /*              mean[i][j] *= t; *//* RAH, compiler was complaining about this,  */
                    mean[i][j] = (float32) ((float64) mean[i][j] * (float64) t);        /*  */
            }
            else if (count[i] == 0) {
                E_ERROR("Iter %d: mean[%d] unmapped\n", it, i);
                memcpy(mean[i], gmean, cols * sizeof(float32));
            }
        }
    }

    ckd_free(count);
    ckd_free(gmean);

    return sqerr;
}